

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c382::TextureWriterTestHelper<unsigned_char,_4U,_32856U>::TextureWriterTestHelper
          (TextureWriterTestHelper<unsigned_char,_4U,_32856U> *this)

{
  WriterTestHelper<unsigned_char,_4U,_32856U>::WriterTestHelper
            (&this->super_WriterTestHelper<unsigned_char,_4U,_32856U>);
  (this->createInfo).super_ktxTextureCreateInfo.glInternalformat = 0x8058;
  return;
}

Assistant:

TextureWriterTestHelper() {}